

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

int __thiscall Centaurus::ParserEM64T<wchar_t>::init(ParserEM64T<wchar_t> *this,EVP_PKEY_CTX *ctx)

{
  CodeHolder *this_00;
  int extraout_EAX;
  Operand_ *o0;
  mapped_type *pmVar1;
  socklen_t sVar2;
  ErrorHandler *in_RCX;
  _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var3;
  Logger *in_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *extraout_RDX_00;
  long *plVar4;
  EVP_PKEY_CTX *pEVar5;
  Label finishlabel;
  Label landfilllabel;
  Label rejectlabel;
  X86Assembler as;
  CompositeATN<wchar_t> catn;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machine_map;
  anon_union_16_7_ed616b9d_for_Operand__0 local_158;
  MyConstPool pool;
  
  this_00 = &this->m_code;
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (in_RDX != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,in_RDX);
  }
  if (in_RCX != (ErrorHandler *)0x0) {
    asmjit::CodeHolder::setErrorHandler(this_00,in_RCX);
  }
  asmjit::X86Assembler::X86Assembler(&as,this_00);
  machine_map._M_h._M_buckets = &machine_map._M_h._M_single_bucket;
  machine_map._M_h._M_bucket_count = 1;
  machine_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  machine_map._M_h._M_element_count = 0;
  machine_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  machine_map._M_h._M_rehash_policy._M_next_resize = 0;
  machine_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  emit_parser_prolog(&as);
  pool.m_as = (X86Assembler *)&DAT_00000032;
  pool.m_zone._ptr = (uint8_t *)0x400000020;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x500),(Operand_ *)&pool);
  pool.m_as = (X86Assembler *)&DAT_00000032;
  pool.m_zone._ptr = (uint8_t *)0x400000018;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),(Operand_ *)&pool);
  pool.m_as = (X86Assembler *)&DAT_00000032;
  pool.m_zone._ptr = (uint8_t *)0x400000010;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4f0),(Operand_ *)&pool);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4a0),
             (Operand_ *)(asmjit::x86OpData + 0x4f0));
  pool.m_as = (X86Assembler *)0x3;
  pool.m_zone._ptr = (uint8_t *)0x800000;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,7,(Operand_ *)(asmjit::x86OpData + 0x4a0),(Operand_ *)&pool);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4d0),
             (Operand_ *)(asmjit::x86OpData + 0x4e0));
  MyConstPool::MyConstPool(&pool,&as);
  local_158._packed[0] = (UInt64)0x110000149;
  local_158._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
  MyConstPool::load_charclass_filter<wchar_t>
            (&pool,(X86Xmm *)&local_158._any,(CharClass<wchar_t> *)m_skipfilter);
  asmjit::Assembler::newLabel((Assembler *)&rejectlabel);
  plVar4 = *(long **)(ctx + 0x20);
  if (plVar4 != (long *)0x0) {
    do {
      asmjit::Assembler::newLabel((Assembler *)&catn);
      std::
      _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<Centaurus::Identifier_const&,asmjit::Label>
                ((_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&machine_map,plVar4 + 1,(Assembler *)&catn);
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
  }
  o0 = (Operand_ *)
       std::__detail::
       _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
       ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&machine_map,(key_type *)(ctx + 0x60));
  asmjit::CodeEmitter::emit((CodeEmitter *)&as,0x3b,o0);
  asmjit::Assembler::newLabel((Assembler *)&landfilllabel);
  sVar2 = 0x192d38;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x58b,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)(asmjit::x86OpData + 0x480));
  asmjit::Assembler::bind(&as.super_Assembler,(int)&landfilllabel,__addr,sVar2);
  catn._vptr_CompositeATN = (_func_int **)&DAT_00000032;
  catn.m_dict._M_h._0_8_ = 0x700000000;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x19c,(Operand_ *)&catn,(Operand_ *)(asmjit::x86OpData + 0x480));
  catn._vptr_CompositeATN = (_func_int **)0x3;
  catn.m_dict._M_h._0_8_ = 8;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,7,(Operand_ *)(asmjit::x86OpData + 0x4f0),(Operand_ *)&catn);
  p_Var3 = (_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            *)(asmjit::x86OpData + 0x4a0);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x67,(Operand_ *)(asmjit::x86OpData + 0x4f0),
             (Operand_ *)(asmjit::x86OpData + 0x4a0));
  asmjit::CodeEmitter::emit((CodeEmitter *)&as,0x124,(Operand_ *)&landfilllabel);
  asmjit::CodeEmitter::emit((CodeEmitter *)&as,0x2a5);
  asmjit::Assembler::newLabel((Assembler *)&finishlabel);
  asmjit::CodeEmitter::emit((CodeEmitter *)&as,0x11e,(Operand_ *)&finishlabel);
  CompositeATN<wchar_t>::CompositeATN(&catn,(Grammar<wchar_t> *)ctx);
  pEVar5 = ctx + 0x20;
  __addr_00 = extraout_RDX;
  while( true ) {
    sVar2 = (socklen_t)p_Var3;
    pEVar5 = *(EVP_PKEY_CTX **)pEVar5;
    if (pEVar5 == (EVP_PKEY_CTX *)0x0) break;
    pmVar1 = std::__detail::
             _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&machine_map,(key_type *)(pEVar5 + 8));
    asmjit::Assembler::bind(&as.super_Assembler,(int)pmVar1,__addr_01,sVar2);
    p_Var3 = (_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&machine_map;
    emit_machine(this,(X86Assembler *)&as.super_Assembler,(ATNMachine<wchar_t> *)(pEVar5 + 0x30),
                 &machine_map,&catn,(key_type *)(pEVar5 + 8),&rejectlabel,&pool);
    __addr_00 = extraout_RDX_00;
  }
  asmjit::Assembler::bind(&as.super_Assembler,(int)&finishlabel,__addr_00,sVar2);
  emit_parser_epilog(&as,&rejectlabel);
  (*((pool.m_as)->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[0xd])
            (pool.m_as,&pool.m_label,&pool.m_pool);
  asmjit::CodeEmitter::finalize((CodeEmitter *)&as);
  (*(this->m_runtime).super_HostRuntime.super_Runtime._vptr_Runtime[2])
            (&this->m_runtime,&this->m_func,this_00);
  catn._vptr_CompositeATN = (_func_int **)&PTR__CompositeATN_001be490;
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&catn.m_dict._M_h);
  asmjit::ConstPool::~ConstPool(&pool.m_pool);
  asmjit::Zone::~Zone(&pool.m_zone);
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&machine_map._M_h);
  asmjit::X86Assembler::~X86Assembler(&as);
  return extraout_EAX;
}

Assistant:

void ParserEM64T<TCHAR>::init(const Grammar<TCHAR>& grammar, asmjit::Logger *logger, asmjit::ErrorHandler *errhandler)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);
    if (errhandler != NULL)
        m_code.setErrorHandler(errhandler);

    asmjit::X86Assembler as(&m_code);

    std::unordered_map<Identifier, asmjit::Label> machine_map;

    emit_parser_prolog(as);

    as.mov(CONTEXT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));
    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG2_STACK_OFFSET));
    as.mov(OUTPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG3_STACK_OFFSET));
    as.mov(OUTPUT_BOUND_REG, OUTPUT_REG);
    as.add(OUTPUT_BOUND_REG, asmjit::Imm(AST_BUF_SIZE));
    as.mov(INPUT_BASE_REG, INPUT_REG);

    MyConstPool pool(as);

    pool.load_charclass_filter(PATTERN_REG, m_skipfilter);

    asmjit::Label rejectlabel = as.newLabel();

    {
        for (const auto& p : grammar.get_machines())
        {
            machine_map.emplace(p.first, as.newLabel());
        }

        as.call(machine_map[grammar.get_root_id()]);
    }

    asmjit::Label landfilllabel = as.newLabel();
    as.xor_(MARKER_REG, MARKER_REG);
    as.bind(landfilllabel);
    as.movnti(asmjit::X86Mem(OUTPUT_REG, 0), MARKER_REG);
    as.add(OUTPUT_REG, asmjit::Imm(8));
    as.cmp(OUTPUT_REG, OUTPUT_BOUND_REG);
    as.jne(landfilllabel);
    as.sfence();

    asmjit::Label finishlabel = as.newLabel();
    as.jmp(finishlabel);

    CompositeATN<TCHAR> catn(grammar);

    for (const auto& p : grammar.get_machines())
    {
        as.bind(machine_map[p.first]);

        emit_machine(as, p.second, machine_map, catn, p.first, rejectlabel, pool);
    }

    as.bind(finishlabel);

    emit_parser_epilog(as, rejectlabel);

    pool.embed();

    as.finalize();

    m_runtime.add(&m_func, &m_code);
}